

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O2

void OutFlowBC::GetOutFlowFaces
               (bool *haveOutFlow,Orientation *outFaces,BCRec *_phys_bc,int *numOutFlowBC)

{
  int idir;
  long lVar1;
  int iVar2;
  
  *haveOutFlow = false;
  *numOutFlowBC = 0;
  iVar2 = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (_phys_bc->bc[lVar1] == 2) {
      *haveOutFlow = true;
      outFaces[iVar2].val = (int)lVar1;
      iVar2 = *numOutFlowBC + 1;
      *numOutFlowBC = iVar2;
    }
    if (_phys_bc->bc[lVar1 + 3] == 2) {
      *haveOutFlow = true;
      outFaces[iVar2].val = (int)lVar1 + 3;
      iVar2 = *numOutFlowBC + 1;
      *numOutFlowBC = iVar2;
    }
  }
  return;
}

Assistant:

void
OutFlowBC::GetOutFlowFaces (bool&        haveOutFlow,
                            Orientation* outFaces,
                            BCRec*       _phys_bc,
                            int&        numOutFlowBC)
{
    haveOutFlow = false;

    numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::low);
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::high);
            numOutFlowBC++;
        }
    }
}